

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void fieldsel(LexState *ls,expdesc *v)

{
  FuncState *fs;
  int iVar1;
  TString *s;
  expdesc local_58;
  
  fs = ls->fs;
  local_58.ravi_type_map = 0;
  local_58._36_4_ = 0;
  local_58.usertype = (TString *)0x0;
  local_58.pc = 0;
  local_58._52_4_ = 0;
  local_58.k = VVOID;
  local_58._4_4_ = 0;
  local_58.u.ival = 0;
  local_58.u.ind.usertype = (TString *)0x0;
  local_58.t = 0;
  local_58.f = 0;
  luaK_exp2anyregup(fs,v);
  luaX_next(ls);
  s = str_checkname(ls);
  iVar1 = luaK_stringK(ls->fs,s);
  local_58.t = -1;
  local_58.f = -1;
  local_58.k = VK;
  local_58.u.info = iVar1;
  local_58.ravi_type_map = 0x100;
  local_58.usertype = (TString *)0x0;
  local_58.pc = -1;
  local_58.u.ind.usertype = (TString *)0x0;
  luaK_indexed(fs,v,&local_58);
  return;
}

Assistant:

static void fieldsel (LexState *ls, expdesc *v) {
  /* fieldsel -> ['.' | ':'] NAME */
  FuncState *fs = ls->fs;
  expdesc key = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  luaK_exp2anyregup(fs, v);
  luaX_next(ls);  /* skip the dot or colon */
  checkname(ls, &key);
  luaK_indexed(fs, v, &key);
}